

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

string * __thiscall
VulkanHppGenerator::generateRAIIHandleCommandEnhanced
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name,
          CommandData *commandData,size_t initialSkipCount,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,bool definition,CommandFlavourFlags flavourFlags)

{
  vector<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_> *params;
  pointer pPVar1;
  size_t *psVar2;
  size_t sVar3;
  bool singular;
  bool bVar4;
  int iVar5;
  size_t returnParam;
  char *pcVar6;
  long lVar7;
  VulkanHppGenerator *this_00;
  VulkanHppGenerator *pVVar8;
  char *pcVar9;
  _Alloc_hider _Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  bool bVar13;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  allocator_type local_82a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_829;
  size_t local_828;
  ulong local_820;
  undefined1 local_818 [24];
  string className;
  string definitionTemplate;
  string nodiscard;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dataTypes;
  string decoratedReturnType;
  string commandName;
  string vectorSizeCheckString;
  undefined1 local_718 [32];
  string callSequence;
  string returnType;
  string noexceptString;
  string argumentList;
  string argumentTemplates;
  string dataType;
  undefined1 local_638 [40];
  size_t local_610;
  undefined1 local_608 [32];
  string returnStatement;
  string resultCheck;
  string dataSizeChecks;
  string dataPreparation;
  string dataDeclarations;
  string returnVariable;
  undefined1 local_528 [40];
  size_t local_500;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> skippedParams;
  pair<bool,_std::map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
  vectorSizeCheck;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_490;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_460;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_430;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_330;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  singular = (bool)((flavourFlags.m_mask & 4) >> 2);
  params = &commandData->params;
  pVVar8 = (VulkanHppGenerator *)&skippedParams;
  this_00 = this;
  local_828 = initialSkipCount;
  determineSkippedParams
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)pVVar8,
             this,params,initialSkipCount,vectorParams,returnParams,singular);
  if ((flavourFlags.m_mask & 4) == 0) {
    local_528._24_8_ = local_528 + 8;
    local_528._0_8_ = (pointer)0x0;
    local_528._8_8_ = 0;
    local_528._16_8_ = 0;
    local_500 = 0;
    local_528._32_8_ = local_528._24_8_;
  }
  else {
    pVVar8 = (VulkanHppGenerator *)local_528;
    determineSingularParams
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               pVVar8,this_00,
               *(returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start,vectorParams);
  }
  if ((flavourFlags.m_mask & 0x40) == 0) {
    pVVar8 = (VulkanHppGenerator *)local_638;
    determineVoidPointerParams
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               pVVar8,this_00,params);
  }
  else {
    local_638._24_8_ = local_638 + 8;
    local_638._0_8_ = (pointer)0x0;
    local_638._8_8_ = (_Base_ptr)0x0;
    local_638._16_8_ = 0;
    local_610 = 0;
    local_638._32_8_ = local_638._24_8_;
  }
  if ((flavourFlags.m_mask & 2) == 0) {
    local_818._0_8_ = (pointer)0x0;
    local_818._8_8_ = (pointer)0x0;
    local_818._16_8_ = 0;
  }
  else {
    pVVar8 = (VulkanHppGenerator *)local_818;
    determineChainedReturnParams
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pVVar8,this,params,
               returnParams);
    if (8 < (ulong)(local_818._8_8_ - local_818._0_8_)) {
      __assert_fail("chainedReturnParams.size() <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x23d4,
                    "std::string VulkanHppGenerator::generateRAIIHandleCommandEnhanced(const std::string &, const CommandData &, size_t, const std::vector<size_t> &, const std::map<size_t, VectorParamData> &, bool, CommandFlavourFlags) const"
                   );
    }
  }
  bVar4 = determineEnumeration(pVVar8,vectorParams,returnParams);
  pVVar8 = this;
  determineDataTypes_abi_cxx11_
            (&dataTypes,this,params,vectorParams,returnParams,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_638);
  local_820 = (ulong)bVar4;
  combineDataTypes(&dataType,pVVar8,vectorParams,returnParams,bVar4,&dataTypes,flavourFlags,true);
  generateArgumentTemplates_abi_cxx11_
            (&argumentTemplates,pVVar8,params,returnParams,vectorParams,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_638,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_818,true);
  generateArgumentListEnhanced_abi_cxx11_
            (&argumentList,this,params,returnParams,vectorParams,&skippedParams,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_528,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_638,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_818,definition
             ,flavourFlags,false);
  generateCommandName(&commandName,this,name,params,local_828,flavourFlags);
  bVar4 = true;
  if ((returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (&commandData->returnType,"VkResult");
    if (iVar5 == 0) {
      bVar4 = false;
    }
    else {
      iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&commandData->returnType,"void");
      bVar4 = iVar5 != 0;
    }
  }
  bVar13 = 0x20 < (ulong)((long)(commandData->successCodes).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(commandData->successCodes).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
  pcVar9 = "";
  if (bVar13 || bVar4) {
    pcVar9 = "VULKAN_HPP_NODISCARD ";
  }
  nodiscard._M_dataplus._M_p = (pointer)&nodiscard.field_2;
  pcVar6 = pcVar9 + 0x15;
  if (!bVar13 && !bVar4) {
    pcVar6 = pcVar9;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&nodiscard,pcVar9,pcVar6);
  pVVar8 = this;
  needsVectorSizeCheck
            (&vectorSizeCheck,this,params,vectorParams,returnParams,
             (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             local_528,&skippedParams);
  generateNoExcept(&noexceptString,pVVar8,&commandData->errorCodes,returnParams,vectorParams,
                   flavourFlags,vectorSizeCheck.first,true);
  generateReturnType(&returnType,pVVar8,returnParams,vectorParams,flavourFlags,true,&dataTypes);
  generateDecoratedReturnType
            (&decoratedReturnType,pVVar8,commandData,returnParams,vectorParams,SUB81(local_820,0),
             flavourFlags,true,&returnType);
  paVar12 = &definitionTemplate.field_2;
  definitionTemplate._M_dataplus._M_p = (pointer)paVar12;
  if (definition) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&definitionTemplate,
               "\n  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html\n  ${argumentTemplates} ${nodiscard} VULKAN_HPP_INLINE ${returnType} ${className}::${commandName}( ${argumentList} ) const ${noexcept}\n  {\n${functionPointerCheck}\n${vectorSizeCheck}\n    ${dataSizeChecks}\n    ${dataDeclarations}\n    ${callSequence}\n    ${resultCheck}\n    ${dataPreparation}\n    ${returnStatement}\n  }\n"
               ,"");
    sVar3 = local_828;
    generateCallSequence
              (&callSequence,this,name,commandData,returnParams,vectorParams,local_828,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_528,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_638,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_818,
               flavourFlags,true,false);
    if (sVar3 == 0) {
      className._M_dataplus._M_p = (pointer)&className.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&className,"Context","");
    }
    else {
      pPVar1 = (params->
               super__Vector_base<VulkanHppGenerator::ParamData,_std::allocator<VulkanHppGenerator::ParamData>_>
               )._M_impl.super__Vector_impl_data._M_start;
      paVar12 = &local_430.first.field_2;
      local_430.first._M_dataplus._M_p = (pointer)paVar12;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"Vk","");
      className._M_dataplus._M_p = (pointer)&className.field_2;
      _Var10._M_p = pPVar1[local_828 - 1].type.type._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&className,_Var10._M_p,
                 _Var10._M_p + pPVar1[local_828 - 1].type.type._M_string_length);
      _Var10._M_p = local_430.first._M_dataplus._M_p;
      if ((local_430.first._M_string_length <= className._M_string_length) &&
         (((_Base_ptr)local_430.first._M_string_length == (_Base_ptr)0x0 ||
          (iVar5 = bcmp(className._M_dataplus._M_p,local_430.first._M_dataplus._M_p,
                        local_430.first._M_string_length), iVar5 == 0)))) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (&className,0,local_430.first._M_string_length);
        _Var10._M_p = local_430.first._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var10._M_p != paVar12) {
        operator_delete(_Var10._M_p,(ulong)(local_430.first.field_2._M_allocated_capacity + 1));
      }
    }
    generateReturnVariable_abi_cxx11_
              (&returnVariable,this,commandData,returnParams,vectorParams,flavourFlags);
    generateDataDeclarations
              (&dataDeclarations,this,commandData,returnParams,vectorParams,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_638,flavourFlags,true,&dataTypes,&dataType,&returnType,&returnVariable);
    pVVar8 = this;
    generateDataPreparation
              (&dataPreparation,this,commandData,local_828,returnParams,vectorParams,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_638,flavourFlags,SUB81(local_820,0),&dataTypes);
    generateDataSizeChecks
              (&dataSizeChecks,pVVar8,commandData,returnParams,&dataTypes,vectorParams,
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               local_638,singular);
    paVar12 = &local_430.first.field_2;
    local_430.first._M_dataplus._M_p = (pointer)paVar12;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"::","");
    local_718._0_8_ = (_Base_ptr)(local_718 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_718,commandName._M_dataplus._M_p,
               commandName._M_dataplus._M_p + commandName._M_string_length);
    generateResultCheck(&resultCheck,this,commandData,&className,&local_430.first,
                        (string *)local_718,SUB81(local_820,0));
    if ((_Base_ptr)local_718._0_8_ != (_Base_ptr)(local_718 + 0x10)) {
      operator_delete((void *)local_718._0_8_,local_718._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430.first._M_dataplus._M_p != paVar12) {
      operator_delete(local_430.first._M_dataplus._M_p,
                      (ulong)(local_430.first.field_2._M_allocated_capacity + 1));
    }
    sVar3 = local_828;
    psVar2 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (psVar2 == (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish) {
      returnParam = 0xffffffffffffffff;
    }
    else {
      returnParam = *psVar2;
    }
    generateReturnStatement
              (&returnStatement,this,name,commandData,&returnVariable,&returnType,
               &decoratedReturnType,&dataType,local_828,returnParam,flavourFlags,SUB81(local_820,0),
               true);
    if (vectorSizeCheck.first == true) {
      generateVectorSizeCheck
                (&vectorSizeCheckString,this,name,commandData,sVar3,&vectorSizeCheck.second,
                 &skippedParams,false);
    }
    else {
      vectorSizeCheckString._M_dataplus._M_p = (pointer)&vectorSizeCheckString.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&vectorSizeCheckString,"");
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_430,(char (*) [13])"argumentList",&argumentList);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[18],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_3f0,(char (*) [18])"argumentTemplates",&argumentTemplates);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_3b0,(char (*) [13])"callSequence",&callSequence);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_370,(char (*) [10])"className",&className);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_330,(char (*) [12])"commandName",&commandName);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[17],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_2f0,(char (*) [17])"dataDeclarations",&dataDeclarations);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[16],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_2b0,(char (*) [16])"dataPreparation",&dataPreparation);
    pcVar9 = "dataSizeChecks";
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_270,(char (*) [15])"dataSizeChecks",&dataSizeChecks);
    generateFunctionPointerCheck
              ((string *)local_608,(VulkanHppGenerator *)pcVar9,name,&commandData->requiredBy,true);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[21],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_230,(char (*) [21])"functionPointerCheck",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_608);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_1f0,(char (*) [10])"nodiscard",&nodiscard);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_1b0,(char (*) [9])"noexcept",&noexceptString);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_170,(char (*) [12])"resultCheck",&resultCheck);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[16],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_130,(char (*) [16])"returnStatement",&returnStatement);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_f0,(char (*) [11])"returnType",&decoratedReturnType);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[16],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_b0,(char (*) [16])"vectorSizeCheck",&vectorSizeCheckString);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[14],_true>(&local_70,(char (*) [14])"vkCommandName",name);
    __l_00._M_len = 0x10;
    __l_00._M_array = &local_430;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&local_460,__l_00,&local_829,&local_82a);
    replaceWithMap(__return_storage_ptr__,&definitionTemplate,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_460);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_460);
    lVar7 = -0x400;
    paVar12 = &local_70.second.field_2;
    do {
      if (paVar12 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar12->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar12->_M_allocated_capacity)[-2],
                        paVar12->_M_allocated_capacity + 1);
      }
      if (&paVar12->_M_allocated_capacity + -4 != (size_type *)(&paVar12->_M_allocated_capacity)[-6]
         ) {
        operator_delete((size_type *)(&paVar12->_M_allocated_capacity)[-6],
                        (&paVar12->_M_allocated_capacity)[-4] + 1);
      }
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar12->_M_allocated_capacity + -8);
      lVar7 = lVar7 + 0x40;
    } while (lVar7 != 0);
    if ((_Base_ptr)local_608._0_8_ != (_Base_ptr)(local_608 + 0x10)) {
      operator_delete((void *)local_608._0_8_,(ulong)(local_608._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)vectorSizeCheckString._M_dataplus._M_p != &vectorSizeCheckString.field_2) {
      operator_delete(vectorSizeCheckString._M_dataplus._M_p,
                      vectorSizeCheckString.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)returnStatement._M_dataplus._M_p != &returnStatement.field_2) {
      operator_delete(returnStatement._M_dataplus._M_p,
                      returnStatement.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)resultCheck._M_dataplus._M_p != &resultCheck.field_2) {
      operator_delete(resultCheck._M_dataplus._M_p,resultCheck.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dataSizeChecks._M_dataplus._M_p != &dataSizeChecks.field_2) {
      operator_delete(dataSizeChecks._M_dataplus._M_p,
                      dataSizeChecks.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dataPreparation._M_dataplus._M_p != &dataPreparation.field_2) {
      operator_delete(dataPreparation._M_dataplus._M_p,
                      dataPreparation.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dataDeclarations._M_dataplus._M_p != &dataDeclarations.field_2) {
      operator_delete(dataDeclarations._M_dataplus._M_p,
                      dataDeclarations.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)returnVariable._M_dataplus._M_p != &returnVariable.field_2) {
      operator_delete(returnVariable._M_dataplus._M_p,
                      returnVariable.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)className._M_dataplus._M_p != &className.field_2) {
      operator_delete(className._M_dataplus._M_p,className.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)callSequence._M_dataplus._M_p != &callSequence.field_2) {
      operator_delete(callSequence._M_dataplus._M_p,callSequence.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)definitionTemplate._M_dataplus._M_p == &definitionTemplate.field_2) goto LAB_001687dc;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&definitionTemplate,
               "\n    // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html\n    ${argumentTemplates} ${nodiscard} ${returnType} ${commandName}( ${argumentList} ) const ${noexcept};\n"
               ,"");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_430,(char (*) [13])"argumentList",&argumentList);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[18],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_3f0,(char (*) [18])"argumentTemplates",&argumentTemplates);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[12],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_3b0,(char (*) [12])"commandName",&commandName);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_370,(char (*) [10])"nodiscard",&nodiscard);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_330,(char (*) [9])"noexcept",&noexceptString);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_2f0,(char (*) [11])"returnType",&decoratedReturnType);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_(&)[14],_true>(&local_2b0,(char (*) [14])"vkCommandName",name);
    __l._M_len = 7;
    __l._M_array = &local_430;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)&local_490,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &callSequence,(allocator_type *)&className);
    replaceWithMap(__return_storage_ptr__,&definitionTemplate,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&local_490);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_490);
    lVar7 = -0x1c0;
    paVar11 = &local_2b0.second.field_2;
    do {
      if (paVar11 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(&paVar11->_M_allocated_capacity)[-2]) {
        operator_delete((long *)(&paVar11->_M_allocated_capacity)[-2],
                        paVar11->_M_allocated_capacity + 1);
      }
      if (&paVar11->_M_allocated_capacity + -4 != (size_type *)(&paVar11->_M_allocated_capacity)[-6]
         ) {
        operator_delete((size_type *)(&paVar11->_M_allocated_capacity)[-6],
                        (&paVar11->_M_allocated_capacity)[-4] + 1);
      }
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar11->_M_allocated_capacity + -8);
      lVar7 = lVar7 + 0x40;
    } while (lVar7 != 0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)definitionTemplate._M_dataplus._M_p == paVar12) goto LAB_001687dc;
  }
  operator_delete(definitionTemplate._M_dataplus._M_p,
                  definitionTemplate.field_2._M_allocated_capacity + 1);
LAB_001687dc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)decoratedReturnType._M_dataplus._M_p != &decoratedReturnType.field_2) {
    operator_delete(decoratedReturnType._M_dataplus._M_p,
                    decoratedReturnType.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)returnType._M_dataplus._M_p != &returnType.field_2) {
    operator_delete(returnType._M_dataplus._M_p,returnType.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)noexceptString._M_dataplus._M_p != &noexceptString.field_2) {
    operator_delete(noexceptString._M_dataplus._M_p,noexceptString.field_2._M_allocated_capacity + 1
                   );
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::~_Rb_tree(&vectorSizeCheck.second._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nodiscard._M_dataplus._M_p != &nodiscard.field_2) {
    operator_delete(nodiscard._M_dataplus._M_p,nodiscard.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)commandName._M_dataplus._M_p != &commandName.field_2) {
    operator_delete(commandName._M_dataplus._M_p,commandName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)argumentList._M_dataplus._M_p != &argumentList.field_2) {
    operator_delete(argumentList._M_dataplus._M_p,argumentList.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)argumentTemplates._M_dataplus._M_p != &argumentTemplates.field_2) {
    operator_delete(argumentTemplates._M_dataplus._M_p,
                    argumentTemplates.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)dataType._M_dataplus._M_p != &dataType.field_2) {
    operator_delete(dataType._M_dataplus._M_p,dataType.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&dataTypes);
  if ((pointer)local_818._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_818._0_8_,local_818._16_8_ - local_818._0_8_);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)local_638);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
               *)local_528);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&skippedParams._M_t);
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleCommandEnhanced( std::string const &                       name,
                                                                   CommandData const &                       commandData,
                                                                   size_t                                    initialSkipCount,
                                                                   std::vector<size_t> const &               returnParams,
                                                                   std::map<size_t, VectorParamData> const & vectorParams,
                                                                   bool                                      definition,
                                                                   CommandFlavourFlags                       flavourFlags ) const
{
  const bool singular = flavourFlags & CommandFlavourFlagBits::singular;

  std::set<size_t> skippedParams  = determineSkippedParams( commandData.params, initialSkipCount, vectorParams, returnParams, singular );
  std::set<size_t> singularParams = singular ? determineSingularParams( returnParams[0], vectorParams ) : std::set<size_t>();
  std::set<size_t> templatedParams =
    ( flavourFlags & CommandFlavourFlagBits::keepVoidPtr ) ? std::set<size_t>() : determineVoidPointerParams( commandData.params );
  std::vector<size_t> chainedReturnParams =
    ( flavourFlags & CommandFlavourFlagBits::chained ) ? determineChainedReturnParams( commandData.params, returnParams ) : std::vector<size_t>();
  assert( chainedReturnParams.size() <= 1 );

  const bool               enumerating = determineEnumeration( vectorParams, returnParams );
  std::vector<std::string> dataTypes   = determineDataTypes( commandData.params, vectorParams, returnParams, templatedParams );
  std::string              dataType    = combineDataTypes( vectorParams, returnParams, enumerating, dataTypes, flavourFlags, true );

  std::string argumentTemplates = generateArgumentTemplates( commandData.params, returnParams, vectorParams, templatedParams, chainedReturnParams, true );
  std::string argumentList      = generateArgumentListEnhanced(
    commandData.params, returnParams, vectorParams, skippedParams, singularParams, templatedParams, chainedReturnParams, definition, flavourFlags, false );
  std::string commandName = generateCommandName( name, commandData.params, initialSkipCount, flavourFlags );
  std::string nodiscard   = generateNoDiscard(
    !returnParams.empty() || ( ( commandData.returnType != "VkResult" ) && ( commandData.returnType != "void" ) ), 1 < commandData.successCodes.size(), false );
  std::pair<bool, std::map<size_t, std::vector<size_t>>> vectorSizeCheck =
    needsVectorSizeCheck( commandData.params, vectorParams, returnParams, singularParams, skippedParams );
  std::string noexceptString      = generateNoExcept( commandData.errorCodes, returnParams, vectorParams, flavourFlags, vectorSizeCheck.first, true );
  std::string returnType          = generateReturnType( returnParams, vectorParams, flavourFlags, true, dataTypes );
  std::string decoratedReturnType = generateDecoratedReturnType( commandData, returnParams, vectorParams, enumerating, flavourFlags, true, returnType );

  if ( definition )
  {
    std::string const definitionTemplate =
      R"(
  // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html
  ${argumentTemplates} ${nodiscard} VULKAN_HPP_INLINE ${returnType} ${className}::${commandName}( ${argumentList} ) const ${noexcept}
  {
${functionPointerCheck}
${vectorSizeCheck}
    ${dataSizeChecks}
    ${dataDeclarations}
    ${callSequence}
    ${resultCheck}
    ${dataPreparation}
    ${returnStatement}
  }
)";

    std::string callSequence = generateCallSequence(
      name, commandData, returnParams, vectorParams, initialSkipCount, singularParams, templatedParams, chainedReturnParams, flavourFlags, true, false );
    std::string className      = initialSkipCount ? stripPrefix( commandData.params[initialSkipCount - 1].type.type, "Vk" ) : "Context";
    std::string returnVariable = generateReturnVariable( commandData, returnParams, vectorParams, flavourFlags );
    std::string dataDeclarations =
      generateDataDeclarations( commandData, returnParams, vectorParams, templatedParams, flavourFlags, true, dataTypes, dataType, returnType, returnVariable );
    std::string dataPreparation =
      generateDataPreparation( commandData, initialSkipCount, returnParams, vectorParams, templatedParams, flavourFlags, enumerating, dataTypes );
    std::string dataSizeChecks  = generateDataSizeChecks( commandData, returnParams, dataTypes, vectorParams, templatedParams, singular );
    std::string resultCheck     = generateResultCheck( commandData, className, "::", commandName, enumerating );
    std::string returnStatement = generateReturnStatement( name,
                                                           commandData,
                                                           returnVariable,
                                                           returnType,
                                                           decoratedReturnType,
                                                           dataType,
                                                           initialSkipCount,
                                                           returnParams.empty() ? INVALID_INDEX : returnParams[0],
                                                           flavourFlags,
                                                           enumerating,
                                                           true );
    std::string vectorSizeCheckString =
      vectorSizeCheck.first ? generateVectorSizeCheck( name, commandData, initialSkipCount, vectorSizeCheck.second, skippedParams, false ) : "";

    return replaceWithMap( definitionTemplate,
                           { { "argumentList", argumentList },
                             { "argumentTemplates", argumentTemplates },
                             { "callSequence", callSequence },
                             { "className", className },
                             { "commandName", commandName },
                             { "dataDeclarations", dataDeclarations },
                             { "dataPreparation", dataPreparation },
                             { "dataSizeChecks", dataSizeChecks },
                             { "functionPointerCheck", generateFunctionPointerCheck( name, commandData.requiredBy, true ) },
                             { "nodiscard", nodiscard },
                             { "noexcept", noexceptString },
                             { "resultCheck", resultCheck },
                             { "returnStatement", returnStatement },
                             { "returnType", decoratedReturnType },
                             { "vectorSizeCheck", vectorSizeCheckString },
                             { "vkCommandName", name } } );
  }
  else
  {
    std::string const declarationTemplate =
      R"(
    // wrapper function for command ${vkCommandName}, see https://registry.khronos.org/vulkan/specs/latest/man/html/${vkCommandName}.html
    ${argumentTemplates} ${nodiscard} ${returnType} ${commandName}( ${argumentList} ) const ${noexcept};
)";

    return replaceWithMap( declarationTemplate,
                           { { "argumentList", argumentList },
                             { "argumentTemplates", argumentTemplates },
                             { "commandName", commandName },
                             { "nodiscard", nodiscard },
                             { "noexcept", noexceptString },
                             { "returnType", decoratedReturnType },
                             { "vkCommandName", name } } );
  }
}